

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O2

NetlistPortDeclaration * __thiscall
netlist::Netlist::addPortDeclaration(Netlist *this,Symbol *symbol)

{
  NetlistPortDeclaration *pNVar1;
  pointer *__ptr;
  NetlistPortDeclaration *local_28;
  _Head_base<0UL,_netlist::NetlistNode_*,_false> local_20;
  
  std::make_unique<netlist::NetlistPortDeclaration,slang::ast::Symbol_const&>((Symbol *)&local_28);
  pNVar1 = local_28;
  slang::ast::Symbol::appendHierarchicalPath(symbol,&local_28->hierarchicalPath);
  local_20._M_head_impl = &local_28->super_NetlistNode;
  local_28 = (NetlistPortDeclaration *)0x0;
  std::
  vector<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>,std::allocator<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>>
  ::emplace_back<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>
            ((vector<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>,std::allocator<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>>
              *)&(this->super_DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>).nodes,
             (unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *)
             &local_20);
  if ((NetlistPortDeclaration *)local_20._M_head_impl != (NetlistPortDeclaration *)0x0) {
    (*(((NetlistNode *)
       &(local_20._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)->
      super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)._vptr_Node[1])();
  }
  if (local_28 != (NetlistPortDeclaration *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return pNVar1;
}

Assistant:

NetlistPortDeclaration& addPortDeclaration(const ast::Symbol& symbol) {
        auto nodePtr = std::make_unique<NetlistPortDeclaration>(symbol);
        auto& node = nodePtr->as<NetlistPortDeclaration>();
        symbol.appendHierarchicalPath(node.hierarchicalPath);
        SLANG_ASSERT(lookupPort(nodePtr->hierarchicalPath) == nullptr &&
                     "Port declaration already exists");
        nodes.push_back(std::move(nodePtr));
        DEBUG_PRINT("New node: port declaration {}\n", node.hierarchicalPath);
        return node;
    }